

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageBitAnd(StackInterpreter *this)

{
  StackMemory *pSVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  size_t sVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Oop b;
  Oop a;
  
  pSVar1 = this->stack;
  paVar2 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(pSVar1->stackFrame).stackPointer;
  a.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar2[1].uintValue;
  b.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar2->uintValue;
  if ((SUB84(b.field_0.uintValue,0) & SUB84(a.field_0.uintValue,0) & 1) == 0) {
    if ((SUB84(b.field_0.uintValue,0) & 7) != 2 || (SUB84(a.field_0.uintValue,0) & 7) != 2) {
      sendSpecialArgumentCount(this,BitAnd,1);
      return;
    }
    sVar3 = this->pc;
    this->pc = sVar3 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar3);
    (pSVar1->stackFrame).stackPointer = (uint8_t *)(paVar2 + 2);
    uVar5 = Oop::decodeCharacter(&a);
    uVar6 = Oop::decodeCharacter(&b);
    lVar9 = (long)(int)((uVar6 & uVar5) * 8 + 2);
  }
  else {
    sVar3 = this->pc;
    this->pc = sVar3 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar3);
    (pSVar1->stackFrame).stackPointer = (uint8_t *)(paVar2 + 2);
    uVar7 = Oop::decodeSmallInteger(&a);
    uVar8 = Oop::decodeSmallInteger(&b);
    lVar9 = (uVar8 & uVar7) * 2 + 1;
  }
  puVar4 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar4 + -8;
  *(long *)(puVar4 + -8) = lVar9;
  return;
}

Assistant:

void interpretSpecialMessageBitAnd()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushOop(Oop::encodeSmallInteger(ia & ib));
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushOop(Oop::encodeCharacter(ca & cb));
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::BitAnd, 1);
        }
    }